

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O0

double xc_bessel_I1(double x)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double r;
  double y;
  double x_small;
  double xmin;
  double local_28;
  
  dVar1 = sqrt(2.220446049250313e-16);
  dVar2 = ABS(in_XMM0_Qa);
  local_28 = 0.0;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    if (4.450147717014403e-308 <= dVar2) {
      if (dVar1 * 2.8284271247461903 <= dVar2) {
        if (3.0 < dVar2) {
          local_28 = exp(in_XMM0_Qa);
          dVar1 = xc_bessel_I1_scaled(r);
          local_28 = local_28 * dVar1;
        }
        else {
          dVar1 = xc_cheb_eval((dVar2 * dVar2) / 4.5 - 1.0,bi1_data,0xb);
          local_28 = in_XMM0_Qa * (dVar1 + 0.875);
        }
      }
      else {
        local_28 = in_XMM0_Qa * 0.5;
      }
    }
    else {
      fprintf(_stderr,"Underflow error in bessel_I1\n");
    }
  }
  else {
    local_28 = 0.0;
  }
  return local_28;
}

Assistant:

GPU_FUNCTION
double xc_bessel_I1(const double x)
{
  const double xmin    = 2.0 * DBL_MIN;
  const double x_small = 2.0 * M_SQRT2 * SQRT_DBL_EPSILON;
  const double y = fabs(x);
  double r = 0.0;

  if(y == 0.0)
    r = 0.0;
  else if(y < xmin) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Underflow error in bessel_I1\n");
#endif
  } else if(y < x_small)
    r = 0.5*x;
  else if(y <= 3.0)
    r = x*(0.875 + xc_cheb_eval(y*y/4.5 - 1.0, bi1_data, 11));
  else
    r = exp(x)*xc_bessel_I1_scaled(x);

  return r;
}